

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::ChangeSurfaceSeam(ON_NurbsSurface *this,int dir,double t)

{
  bool bVar1;
  uint uVar2;
  ON_NurbsCurve *pOVar3;
  bool local_ab;
  undefined1 local_80 [8];
  ON_NurbsCurve crv;
  ON_Interval current_domain;
  bool rc;
  double t_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  if ((dir < 0) || (1 < dir)) {
    this_local._7_1_ = false;
  }
  else {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    current_domain.m_t[1]._7_1_ = ON_Interval::Includes((ON_Interval *)&crv.m_cv,t,false);
    if ((current_domain.m_t[1]._7_1_) &&
       (uVar2 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x30])
                          (this,(ulong)(uint)dir), (uVar2 & 1) != 0)) {
      ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
      ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_80);
      pOVar3 = ToCurve(this,dir,(ON_NurbsCurve *)local_80);
      current_domain.m_t[1]._7_1_ = pOVar3 != (ON_NurbsCurve *)0x0;
      if (current_domain.m_t[1]._7_1_) {
        current_domain.m_t[1]._7_1_ =
             ON_NurbsCurve::ChangeClosedCurveSeam((ON_NurbsCurve *)local_80,t);
      }
      bVar1 = FromCurve((ON_NurbsCurve *)local_80,this,dir);
      local_ab = false;
      if (bVar1) {
        local_ab = current_domain.m_t[1]._7_1_;
      }
      current_domain.m_t[1]._7_1_ = local_ab;
      ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_80);
    }
    this_local._7_1_ = current_domain.m_t[1]._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool 
ON_NurbsSurface::ChangeSurfaceSeam( 
						int dir,
            double t 
            )
{
	bool rc = true;

  if ( dir < 0 || dir > 1 )
    return false;

  ON_Interval current_domain = Domain(dir);
	if( !current_domain.Includes( t) )
		rc = false;
	
	if(rc && IsClosed(dir) ){
		DestroySurfaceTree();
		ON_NurbsCurve crv;
		rc = ToCurve(*this, dir, &crv)!=nullptr;
		if(rc)
			rc = crv.ChangeClosedCurveSeam(t)!=0;
		rc = FromCurve(crv,*this, dir) && rc;
	}

	return rc;
}